

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zfgmr.c
# Opt level: O0

int zfgmr(int n,_func_void_doublecomplex_doublecomplex_ptr_doublecomplex_doublecomplex_ptr *zmatvec,
         _func_void_int_doublecomplex_ptr_doublecomplex_ptr *zpsolve,doublecomplex *rhs,
         doublecomplex *sol,double tol,int im,int *itmax,FILE *fits)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  long *addr;
  doublecomplex *pdVar10;
  void *addr_00;
  void *addr_01;
  doublecomplex *addr_02;
  doublecomplex *addr_03;
  doublecomplex *addr_04;
  double dVar11;
  double *pdVar12;
  doublecomplex *extraout_RDX;
  doublecomplex *extraout_RDX_00;
  doublecomplex *extraout_RDX_01;
  doublecomplex *extraout_RDX_02;
  doublereal dVar13;
  doublereal dVar14;
  double dVar15;
  int local_298;
  int local_294;
  int i_6;
  int i_5;
  int retval;
  int j_6;
  double ci_11;
  double cr_11;
  int k_5;
  doublecomplex tt_4;
  int j_5;
  double ci_10;
  double cr_10;
  undefined1 auStack_240 [4];
  int j_4;
  doublecomplex tt_3;
  int k_4;
  int ii;
  double ci_9;
  double cr_9;
  double ci_8;
  double cr_8;
  double ci_7;
  double cr_7;
  double ci_6;
  double cr_6;
  double gam;
  double ci_5;
  double cr_5;
  double ci_4;
  double cr_4;
  double ci_3;
  double cr_3;
  double ci_2;
  double cr_2;
  doublecomplex tt_2;
  int local_188;
  int k1;
  int k_3;
  int k_2;
  double ci_1;
  double cr_1;
  double dStack_168;
  int k_1;
  doublecomplex tt_1;
  doublecomplex negt_1;
  int j_3;
  double ci;
  double cr;
  double dStack_128;
  int k;
  doublecomplex tt;
  doublecomplex negt;
  doublereal dStack_100;
  int j_2;
  double t0;
  int local_f0;
  int i1;
  int i_4;
  int j_1;
  double t;
  double beta;
  int local_d0;
  int j;
  int i_3;
  int i;
  doublecomplex tt2;
  doublecomplex tt1;
  doublecomplex one;
  doublecomplex zero;
  doublecomplex **z;
  doublecomplex **vv;
  doublecomplex *rs;
  doublecomplex *s;
  doublecomplex *c;
  doublecomplex **hh;
  double eps1;
  integer local_48;
  int i_2;
  int i_1;
  int its;
  int maxits;
  int im_local;
  double tol_local;
  doublecomplex *sol_local;
  doublecomplex *rhs_local;
  _func_void_int_doublecomplex_ptr_doublecomplex_ptr *zpsolve_local;
  _func_void_doublecomplex_doublecomplex_ptr_doublecomplex_doublecomplex_ptr *zmatvec_local;
  int n_local;
  
  i_1 = *itmax;
  local_48 = 1;
  eps1._4_4_ = 2;
  hh = (doublecomplex **)0x0;
  its = im;
  _maxits = tol;
  tol_local = (double)sol;
  sol_local = rhs;
  rhs_local = (doublecomplex *)zpsolve;
  zpsolve_local = (_func_void_int_doublecomplex_ptr_doublecomplex_ptr *)zmatvec;
  zmatvec_local._4_4_ = n;
  memset(&one.i,0,0x10);
  one.r = 0.0;
  i_2 = 0;
  addr = (long *)superlu_malloc((long)(its + 1) << 3);
  for (j = 0; j <= its; j = j + 1) {
    pdVar10 = doublecomplexMalloc((long)zmatvec_local._4_4_);
    addr[j] = (long)pdVar10;
  }
  addr_00 = superlu_malloc((long)its << 3);
  addr_01 = superlu_malloc((long)its << 3);
  for (local_d0 = 0; local_d0 < its; local_d0 = local_d0 + 1) {
    pdVar10 = doublecomplexMalloc((long)(local_d0 + 2));
    *(doublecomplex **)((long)addr_01 + (long)local_d0 * 8) = pdVar10;
    pdVar10 = doublecomplexMalloc((long)zmatvec_local._4_4_);
    *(doublecomplex **)((long)addr_00 + (long)local_d0 * 8) = pdVar10;
  }
  addr_02 = doublecomplexMalloc((long)its);
  addr_03 = doublecomplexMalloc((long)its);
  addr_04 = doublecomplexMalloc((long)(its + 1));
  pdVar10 = extraout_RDX;
  do {
    (*zpsolve_local)(SUB84(tol_local,0),(doublecomplex *)*addr,pdVar10);
    for (beta._4_4_ = 0; beta._4_4_ < zmatvec_local._4_4_; beta._4_4_ = beta._4_4_ + 1) {
      *(double *)(*addr + (long)beta._4_4_ * 0x10) =
           sol_local[beta._4_4_].r - *(double *)(*addr + (long)beta._4_4_ * 0x10);
      *(double *)(*addr + (long)beta._4_4_ * 0x10 + 8) =
           sol_local[beta._4_4_].i - *(double *)(*addr + (long)beta._4_4_ * 0x10 + 8);
    }
    dVar13 = dznrm2_((integer *)((long)&zmatvec_local + 4),(doublecomplex *)*addr,&local_48);
    if ((fits != (FILE *)0x0) && (i_2 == 0)) {
      fprintf((FILE *)fits,"%8d   %10.2e\n",dVar13,0);
    }
    dVar15 = _maxits;
    dVar14 = dznrm2_((integer *)((long)&zmatvec_local + 4),sol_local,&local_48);
    if (dVar13 <= dVar15 * dVar14) goto LAB_001046ca;
    for (i1 = 0; i1 < zmatvec_local._4_4_; i1 = i1 + 1) {
      *(double *)(*addr + (long)i1 * 0x10) = *(double *)(*addr + (long)i1 * 0x10) * (1.0 / dVar13);
      *(double *)(*addr + (long)i1 * 0x10 + 8) =
           *(double *)(*addr + (long)i1 * 0x10 + 8) * (1.0 / dVar13);
    }
    if (i_2 == 0) {
      hh = (doublecomplex **)(_maxits * dVar13);
    }
    addr_04->r = dVar13;
    addr_04->i = 0.0;
    for (local_f0 = 0; local_f0 < its; local_f0 = local_f0 + 1) {
      i_2 = i_2 + 1;
      iVar8 = local_f0 + 1;
      if (rhs_local == (doublecomplex *)0x0) {
        zcopy_((integer *)((long)&zmatvec_local + 4),(doublecomplex *)addr[local_f0],&local_48,
               *(doublecomplex **)((long)addr_00 + (long)local_f0 * 8),&local_48);
      }
      else {
        (*(code *)rhs_local)
                  (zmatvec_local._4_4_,*(undefined8 *)((long)addr_00 + (long)local_f0 * 8),
                   addr[local_f0]);
      }
      (*zpsolve_local)((int)*(undefined8 *)((long)addr_00 + (long)local_f0 * 8),
                       (doublecomplex *)addr[iVar8],(doublecomplex *)(long)iVar8);
      dStack_100 = dznrm2_((integer *)((long)&zmatvec_local + 4),(doublecomplex *)addr[iVar8],
                           &local_48);
      for (negt.i._4_4_ = 0; negt.i._4_4_ <= local_f0; negt.i._4_4_ = negt.i._4_4_ + 1) {
        dStack_128 = one.i;
        tt.r = zero.r;
        for (cr._4_4_ = 0; cr._4_4_ < zmatvec_local._4_4_; cr._4_4_ = cr._4_4_ + 1) {
          dVar15 = *(double *)(addr[negt.i._4_4_] + (long)cr._4_4_ * 0x10);
          dVar11 = -*(double *)(addr[negt.i._4_4_] + (long)cr._4_4_ * 0x10 + 8);
          dStack_128 = dStack_128 +
                       dVar15 * *(double *)(addr[iVar8] + (long)cr._4_4_ * 0x10) +
                       -(dVar11 * *(double *)(addr[iVar8] + (long)cr._4_4_ * 0x10 + 8));
          tt.r = tt.r + dVar11 * *(double *)(addr[iVar8] + (long)cr._4_4_ * 0x10) +
                        dVar15 * *(double *)(addr[iVar8] + (long)cr._4_4_ * 0x10 + 8);
        }
        pdVar12 = (double *)
                  (*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)negt.i._4_4_ * 0x10);
        *pdVar12 = dStack_128;
        pdVar12[1] = tt.r;
        tt.i = -dStack_128;
        zaxpy_((integer *)((long)&zmatvec_local + 4),(doublecomplex *)&tt.i,
               (doublecomplex *)addr[negt.i._4_4_],&local_48,(doublecomplex *)addr[iVar8],&local_48)
        ;
      }
      _i_4 = dznrm2_((integer *)((long)&zmatvec_local + 4),(doublecomplex *)addr[iVar8],&local_48);
      while (_i_4 < dStack_100 * 0.5) {
        dStack_100 = _i_4;
        for (negt_1.i._4_4_ = 0; negt_1.i._4_4_ <= local_f0; negt_1.i._4_4_ = negt_1.i._4_4_ + 1) {
          dStack_168 = one.i;
          tt_1.r = zero.r;
          for (cr_1._4_4_ = 0; cr_1._4_4_ < zmatvec_local._4_4_; cr_1._4_4_ = cr_1._4_4_ + 1) {
            dVar15 = *(double *)(addr[negt_1.i._4_4_] + (long)cr_1._4_4_ * 0x10);
            dVar11 = -*(double *)(addr[negt_1.i._4_4_] + (long)cr_1._4_4_ * 0x10 + 8);
            dStack_168 = dStack_168 +
                         dVar15 * *(double *)(addr[iVar8] + (long)cr_1._4_4_ * 0x10) +
                         -(dVar11 * *(double *)(addr[iVar8] + (long)cr_1._4_4_ * 0x10 + 8));
            tt_1.r = tt_1.r + dVar11 * *(double *)(addr[iVar8] + (long)cr_1._4_4_ * 0x10) +
                              dVar15 * *(double *)(addr[iVar8] + (long)cr_1._4_4_ * 0x10 + 8);
          }
          *(double *)(*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)negt_1.i._4_4_ * 0x10) =
               *(double *)
                (*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)negt_1.i._4_4_ * 0x10) +
               dStack_168;
          *(double *)
           (*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)negt_1.i._4_4_ * 0x10 + 8) =
               *(double *)
                (*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)negt_1.i._4_4_ * 0x10 + 8) +
               tt_1.r;
          tt_1.i = -dStack_168;
          zaxpy_((integer *)((long)&zmatvec_local + 4),(doublecomplex *)&tt_1.i,
                 (doublecomplex *)addr[negt_1.i._4_4_],&local_48,(doublecomplex *)addr[iVar8],
                 &local_48);
        }
        _i_4 = dznrm2_((integer *)((long)&zmatvec_local + 4),(doublecomplex *)addr[iVar8],&local_48)
        ;
      }
      *(doublereal *)(*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)iVar8 * 0x10) = _i_4;
      *(undefined8 *)(*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)iVar8 * 0x10 + 8) = 0;
      if ((_i_4 != 0.0) || (NAN(_i_4))) {
        for (k1 = 0; k1 < zmatvec_local._4_4_; k1 = k1 + 1) {
          *(double *)(addr[iVar8] + (long)k1 * 0x10) =
               *(double *)(addr[iVar8] + (long)k1 * 0x10) * (1.0 / _i_4);
          *(double *)(addr[iVar8] + (long)k1 * 0x10 + 8) =
               *(double *)(addr[iVar8] + (long)k1 * 0x10 + 8) * (1.0 / _i_4);
        }
      }
      for (local_188 = 1; local_188 <= local_f0; local_188 = local_188 + 1) {
        iVar9 = local_188 + -1;
        pdVar12 = (double *)(*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)iVar9 * 0x10);
        dVar5 = *pdVar12;
        dVar6 = pdVar12[1];
        dVar15 = addr_02[iVar9].i;
        dVar11 = addr_02[iVar9].r;
        dVar1 = addr_03[iVar9].i;
        dVar2 = *(double *)(*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)local_188 * 0x10);
        dVar3 = addr_03[iVar9].r;
        dVar4 = *(double *)
                 (*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)local_188 * 0x10 + 8);
        *(double *)(*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)iVar9 * 0x10) =
             addr_02[iVar9].r * dVar5 + -(addr_02[iVar9].i * dVar6) +
             addr_03[iVar9].r *
             *(double *)(*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)local_188 * 0x10) +
             -(addr_03[iVar9].i *
              *(double *)
               (*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)local_188 * 0x10 + 8));
        *(double *)(*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)iVar9 * 0x10 + 8) =
             dVar15 * dVar5 + dVar11 * dVar6 + dVar1 * dVar2 + dVar3 * dVar4;
        dVar15 = addr_03[iVar9].i;
        dVar11 = addr_03[iVar9].r;
        dVar1 = addr_02[iVar9].i;
        dVar2 = *(double *)(*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)local_188 * 0x10);
        dVar3 = addr_02[iVar9].r;
        dVar4 = *(double *)
                 (*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)local_188 * 0x10 + 8);
        *(double *)(*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)local_188 * 0x10) =
             (addr_02[iVar9].r *
              *(double *)(*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)local_188 * 0x10) +
             -(addr_02[iVar9].i *
              *(double *)
               (*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)local_188 * 0x10 + 8))) -
             (addr_03[iVar9].r * dVar5 + -(addr_03[iVar9].i * dVar6));
        *(double *)(*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)local_188 * 0x10 + 8) =
             (dVar1 * dVar2 + dVar3 * dVar4) - (dVar15 * dVar5 + dVar11 * dVar6);
      }
      dVar13 = dznrm2_((integer *)((long)&eps1 + 4),
                       (doublecomplex *)
                       (*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)local_f0 * 0x10),
                       &local_48);
      if ((dVar13 != 0.0) || (NAN(dVar13))) {
        dVar15 = 1.0 / dVar13;
        addr_02[local_f0].r =
             *(double *)(*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)local_f0 * 0x10) *
             dVar15;
        addr_02[local_f0].i =
             *(double *)(*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)local_f0 * 0x10 + 8)
             * dVar15;
        addr_03[local_f0].r =
             *(double *)(*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)iVar8 * 0x10) *
             dVar15;
        addr_03[local_f0].i =
             *(double *)(*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)iVar8 * 0x10 + 8) *
             dVar15;
      }
      else {
        addr_02[local_f0].r = 1.0;
        addr_02[local_f0].i = one.r;
        addr_03[local_f0].r = one.i;
        addr_03[local_f0].i = zero.r;
      }
      dVar15 = addr_03[local_f0].i;
      dVar11 = addr_04[local_f0].r;
      dVar1 = addr_03[local_f0].r;
      dVar2 = addr_04[local_f0].i;
      addr_04[iVar8].r =
           addr_03[local_f0].r * addr_04[local_f0].r + -(addr_03[local_f0].i * addr_04[local_f0].i);
      addr_04[iVar8].i = dVar15 * dVar11 + dVar1 * dVar2;
      addr_04[iVar8].r = -addr_04[iVar8].r;
      addr_04[iVar8].i = -addr_04[iVar8].i;
      dVar15 = addr_02[local_f0].i;
      dVar11 = addr_04[local_f0].r;
      dVar1 = addr_02[local_f0].r;
      dVar2 = addr_04[local_f0].i;
      addr_04[local_f0].r =
           addr_02[local_f0].r * addr_04[local_f0].r + -(addr_02[local_f0].i * addr_04[local_f0].i);
      addr_04[local_f0].i = dVar15 * dVar11 + dVar1 * dVar2;
      dVar15 = addr_02[local_f0].i;
      dVar11 = *(double *)(*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)local_f0 * 0x10);
      dVar1 = addr_02[local_f0].r;
      dVar2 = *(double *)(*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)local_f0 * 0x10 + 8)
      ;
      dVar3 = addr_03[local_f0].i;
      dVar4 = *(double *)(*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)iVar8 * 0x10);
      dVar5 = addr_03[local_f0].r;
      dVar6 = *(double *)(*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)iVar8 * 0x10 + 8);
      *(double *)(*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)local_f0 * 0x10) =
           addr_02[local_f0].r *
           *(double *)(*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)local_f0 * 0x10) +
           -(addr_02[local_f0].i *
            *(double *)(*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)local_f0 * 0x10 + 8))
           + addr_03[local_f0].r *
             *(double *)(*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)iVar8 * 0x10) +
             -(addr_03[local_f0].i *
              *(double *)(*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)iVar8 * 0x10 + 8));
      *(double *)(*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)local_f0 * 0x10 + 8) =
           dVar15 * dVar11 + dVar1 * dVar2 + dVar3 * dVar4 + dVar5 * dVar6;
      dVar15 = z_abs1(addr_04 + iVar8);
      if (fits != (FILE *)0x0) {
        fprintf((FILE *)fits,"%8d   %10.2e\n",dVar15,(ulong)(uint)i_2);
      }
      if ((dVar15 <= (double)hh) || (i_1 <= i_2)) break;
    }
    if (local_f0 == its) {
      local_f0 = local_f0 + -1;
    }
    z_div(addr_04 + local_f0,addr_04 + local_f0,
          (doublecomplex *)(*(long *)((long)addr_01 + (long)local_f0 * 8) + (long)local_f0 * 0x10));
    pdVar10 = extraout_RDX_00;
    for (tt_3.i._4_4_ = 1; tt_3.i._4_4_ <= local_f0; tt_3.i._4_4_ = tt_3.i._4_4_ + 1) {
      tt_3.i._0_4_ = local_f0 - tt_3.i._4_4_;
      _auStack_240 = addr_04[tt_3.i._0_4_].r;
      tt_3.r = addr_04[tt_3.i._0_4_].i;
      cr_10._4_4_ = tt_3.i._0_4_;
      while (cr_10._4_4_ = cr_10._4_4_ + 1, cr_10._4_4_ <= local_f0) {
        _auStack_240 = _auStack_240 -
                       (*(double *)
                         (*(long *)((long)addr_01 + (long)cr_10._4_4_ * 8) +
                         (long)tt_3.i._0_4_ * 0x10) * addr_04[cr_10._4_4_].r +
                       -(*(double *)
                          (*(long *)((long)addr_01 + (long)cr_10._4_4_ * 8) +
                           (long)tt_3.i._0_4_ * 0x10 + 8) * addr_04[cr_10._4_4_].i));
        tt_3.r = tt_3.r - (*(double *)
                            (*(long *)((long)addr_01 + (long)cr_10._4_4_ * 8) +
                             (long)tt_3.i._0_4_ * 0x10 + 8) * addr_04[cr_10._4_4_].r +
                          *(double *)
                           (*(long *)((long)addr_01 + (long)cr_10._4_4_ * 8) +
                           (long)tt_3.i._0_4_ * 0x10) * addr_04[cr_10._4_4_].i);
      }
      z_div(addr_04 + tt_3.i._0_4_,(doublecomplex *)auStack_240,
            (doublecomplex *)
            (*(long *)((long)addr_01 + (long)tt_3.i._0_4_ * 8) + (long)tt_3.i._0_4_ * 0x10));
      pdVar10 = extraout_RDX_01;
    }
    for (tt_4.i._4_4_ = 0; tt_4.i._4_4_ <= local_f0; tt_4.i._4_4_ = tt_4.i._4_4_ + 1) {
      dVar15 = addr_04[tt_4.i._4_4_].r;
      dVar11 = addr_04[tt_4.i._4_4_].i;
      for (cr_11._4_4_ = 0; cr_11._4_4_ < zmatvec_local._4_4_; cr_11._4_4_ = cr_11._4_4_ + 1) {
        dVar1 = *(double *)
                 (*(long *)((long)addr_00 + (long)tt_4.i._4_4_ * 8) + (long)cr_11._4_4_ * 0x10);
        dVar2 = *(double *)
                 (*(long *)((long)addr_00 + (long)tt_4.i._4_4_ * 8) + (long)cr_11._4_4_ * 0x10 + 8);
        *(double *)((long)tol_local + (long)cr_11._4_4_ * 0x10) =
             *(double *)((long)tol_local + (long)cr_11._4_4_ * 0x10) +
             dVar15 * *(double *)
                       (*(long *)((long)addr_00 + (long)tt_4.i._4_4_ * 8) + (long)cr_11._4_4_ * 0x10
                       ) +
             -(dVar11 * *(double *)
                         (*(long *)((long)addr_00 + (long)tt_4.i._4_4_ * 8) +
                          (long)cr_11._4_4_ * 0x10 + 8));
        *(double *)((long)tol_local + (long)cr_11._4_4_ * 0x10 + 8) =
             *(double *)((long)tol_local + (long)cr_11._4_4_ * 0x10 + 8) +
             dVar11 * dVar1 + dVar15 * dVar2;
      }
    }
    (*zpsolve_local)(SUB84(tol_local,0),(doublecomplex *)*addr,pdVar10);
    for (i_5 = 0; i_5 < zmatvec_local._4_4_; i_5 = i_5 + 1) {
      *(double *)(*addr + (long)i_5 * 0x10) =
           sol_local[i_5].r - *(double *)(*addr + (long)i_5 * 0x10);
      *(double *)(*addr + (long)i_5 * 0x10 + 8) =
           sol_local[i_5].i - *(double *)(*addr + (long)i_5 * 0x10 + 8);
    }
    dVar13 = dznrm2_((integer *)((long)&zmatvec_local + 4),(doublecomplex *)*addr,&local_48);
    if ((double)hh / _maxits <= dVar13) {
      i_2 = i_1 + 10;
LAB_001046ca:
      bVar7 = i_1 <= i_2;
      for (local_294 = 0; local_294 <= its; local_294 = local_294 + 1) {
        superlu_free((void *)addr[local_294]);
      }
      superlu_free(addr);
      for (local_298 = 0; local_298 < its; local_298 = local_298 + 1) {
        superlu_free(*(void **)((long)addr_01 + (long)local_298 * 8));
        superlu_free(*(void **)((long)addr_00 + (long)local_298 * 8));
      }
      superlu_free(addr_01);
      superlu_free(addr_00);
      superlu_free(addr_02);
      superlu_free(addr_03);
      superlu_free(addr_04);
      *itmax = i_2;
      return (uint)bVar7;
    }
    if ((dVar13 <= (double)hh) || (pdVar10 = extraout_RDX_02, i_1 <= i_2)) goto LAB_001046ca;
  } while( true );
}

Assistant:

int zfgmr(int n,
     void (*zmatvec) (doublecomplex, doublecomplex[], doublecomplex, doublecomplex[]),
     void (*zpsolve) (int, doublecomplex[], doublecomplex[]),
     doublecomplex *rhs, doublecomplex *sol, double tol, int im, int *itmax, FILE * fits)
{
/*----------------------------------------------------------------------
|                 *** Preconditioned FGMRES ***
+-----------------------------------------------------------------------
| This is a simple version of the ARMS preconditioned FGMRES algorithm.
+-----------------------------------------------------------------------
| Y. S. Dec. 2000. -- Apr. 2008
+-----------------------------------------------------------------------
| on entry:
|----------
|
| rhs     = real vector of length n containing the right hand side.
| sol     = real vector of length n containing an initial guess to the
|           solution on input.
| tol     = tolerance for stopping iteration
| im      = Krylov subspace dimension
| (itmax) = max number of iterations allowed.
| fits    = NULL: no output
|        != NULL: file handle to output " resid vs time and its"
|
| on return:
|----------
| fgmr      int =  0 --> successful return.
|           int =  1 --> convergence not achieved in itmax iterations.
| sol     = contains an approximate solution (upon successful return).
| itmax   = has changed. It now contains the number of steps required
|           to converge --
+-----------------------------------------------------------------------
| internal work arrays:
|----------
| vv      = work array of length [im+1][n] (used to store the Arnoldi
|           basis)
| hh      = work array of length [im][im+1] (Householder matrix)
| z       = work array of length [im][n] to store preconditioned vectors
+-----------------------------------------------------------------------
| subroutines called :
| matvec - matrix-vector multiplication operation
| psolve - (right) preconditioning operation
|	   psolve can be a NULL pointer (GMRES without preconditioner)
+---------------------------------------------------------------------*/

    int maxits = *itmax;
    int its, i_1 = 1, i_2 = 2;
    double eps1 = 0.0;
    doublecomplex **hh, *c, *s, *rs;
    doublecomplex **vv, **z;
    doublecomplex zero = {0.0, 0.0};
    doublecomplex one = {1.0, 0.0};
    doublecomplex tt1, tt2;

    its = 0;
    vv = (doublecomplex **)SUPERLU_MALLOC((im + 1) * sizeof(doublecomplex *));
    for (int i = 0; i <= im; i++) vv[i] = doublecomplexMalloc(n);
    z = (doublecomplex **)SUPERLU_MALLOC(im * sizeof(doublecomplex *));
    hh = (doublecomplex **)SUPERLU_MALLOC(im * sizeof(doublecomplex *));
    for (int i = 0; i < im; i++)
    {
	hh[i] = doublecomplexMalloc(i + 2);
	z[i] = doublecomplexMalloc(n);
    }
    c = doublecomplexMalloc(im);
    s = doublecomplexMalloc(im);
    rs = doublecomplexMalloc(im + 1);

    /*---- outer loop starts here ----*/
    do
    {
	/*---- compute initial residual vector ----*/
	zmatvec(one, sol, zero, vv[0]);
	for (int j = 0; j < n; j++)
	    z_sub(&vv[0][j], &rhs[j], &vv[0][j]);	/* vv[0]= initial residual */
	double beta = dznrm2_(&n, vv[0], &i_1);

	/*---- print info if fits != null ----*/
	if (fits != NULL && its == 0)
	    fprintf(fits, "%8d   %10.2e\n", its, beta);
	/*if ( beta <= tol * dnrm2_(&n, rhs, &i_1) )*/
	if ( !(beta > tol * dznrm2_(&n, rhs, &i_1)) )
	    break;
	double t = 1.0 / beta;

	/*---- normalize: vv[0] = vv[0] / beta ----*/
	for (int j = 0; j < n; j++)
	    zd_mult(&vv[0][j], &vv[0][j], t);
	if (its == 0)
	    eps1 = tol * beta;

	/*---- initialize 1-st term of rhs of hessenberg system ----*/
	rs[0].r = beta;
	rs[0].i = 0.0;
	int i = 0;
	for (i = 0; i < im; i++)
	{
	    its++;
	    int i1 = i + 1;

	    /*------------------------------------------------------------
	    |  (Right) Preconditioning Operation   z_{j} = M^{-1} v_{j}
	    +-----------------------------------------------------------*/
	    if (zpsolve)
		zpsolve(n, z[i], vv[i]);
	    else
		zcopy_(&n, vv[i], &i_1, z[i], &i_1);

	    /*---- matvec operation w = A z_{j} = A M^{-1} v_{j} ----*/
	    zmatvec(one, z[i], zero, vv[i1]);

	    /*------------------------------------------------------------
	    |     modified gram - schmidt...
	    |     h_{i,j} = (w,v_{i})
	    |     w  = w - h_{i,j} v_{i}
	    +------------------------------------------------------------*/
	    double t0 = dznrm2_(&n, vv[i1], &i_1);
	    for (int j = 0; j <= i; j++)
	    {
		doublecomplex negt;
#if 0
		zdotc_(&tt, &n, vv[j], &i_1, vv[i1], &i_1);
#else
		doublecomplex tt = zero;
		for (int k = 0; k < n; ++k) {
		    zz_conj(&tt1, &vv[j][k]);
		    zz_mult(&tt2, &tt1, &vv[i1][k]);
		    z_add(&tt, &tt, &tt2);
		}
#endif
		hh[i][j] = tt;
		negt.r = -tt.r;
		negt.i = -tt.i;
		zaxpy_(&n, &negt, vv[j], &i_1, vv[i1], &i_1);
	    }

	    /*---- h_{j+1,j} = ||w||_{2} ----*/
	    t = dznrm2_(&n, vv[i1], &i_1);
	    while (t < 0.5 * t0)
	    {
		t0 = t;
		for (int j = 0; j <= i; j++)
		{
		    doublecomplex negt;
#if 0
		    zdotc_(&tt, &n, vv[j], &i_1, vv[i1], &i_1);
#else
   	            doublecomplex tt = zero;
		    for (int k = 0; k < n; ++k) {
		        zz_conj(&tt1, &vv[j][k]);
		        zz_mult(&tt2, &tt1, &vv[i1][k]);
		        z_add(&tt, &tt, &tt2);
		    }
#endif
		    z_add(&hh[i][j], &hh[i][j], &tt);
		    negt.r = -tt.r;
		    negt.i = -tt.i;
		    zaxpy_(&n, &negt, vv[j], &i_1, vv[i1], &i_1);
		}
		t = dznrm2_(&n, vv[i1], &i_1);
	    }

	    hh[i][i1].r = t;
	    hh[i][i1].i = 0.0;

	    if (t != 0.0)
	    {
		/*---- v_{j+1} = w / h_{j+1,j} ----*/
		t = 1.0 / t;
		for (int k = 0; k < n; k++)
	            zd_mult(&vv[i1][k], &vv[i1][k], t);
	    }
	    /*---------------------------------------------------
	    |     done with modified gram schmidt and arnoldi step
	    |     now  update factorization of hh
	    +--------------------------------------------------*/

	    /*--------------------------------------------------------
	    |   perform previous transformations  on i-th column of h
	    +-------------------------------------------------------*/
	    for (int k = 1; k <= i; k++)
	    {
		int k1 = k - 1;
		doublecomplex tt = hh[i][k1];
                zz_mult(&tt1, &c[k1], &tt);
                zz_mult(&tt2, &s[k1], &hh[i][k]);
                z_add(&hh[i][k1], &tt1, &tt2);

                zz_mult(&tt1, &s[k1], &tt);
                zz_mult(&tt2, &c[k1], &hh[i][k]);
                z_sub(&hh[i][k], &tt2, &tt1);
	    }

	    double gam = dznrm2_(&i_2, &hh[i][i], &i_1);

	    /*---------------------------------------------------
	    |     if gamma is zero then any small value will do
	    |     affect only residual estimate
	    +--------------------------------------------------*/
	    /* if (gam == 0.0) gam = epsmac; */

	    /*---- get next plane rotation ---*/
	    if (gam == 0.0)
	    {
		c[i] = one;
		s[i] = zero;
	    }
            else
	    {
                gam = 1.0 / gam;
		zd_mult(&c[i], &hh[i][i], gam);
		zd_mult(&s[i], &hh[i][i1], gam);
	    }

	    zz_mult(&rs[i1], &s[i], &rs[i]);
            rs[i1].r = -rs[i1].r;  rs[i1].i = -rs[i1].i;
	    zz_mult(&rs[i], &c[i], &rs[i]);

	    /*----------------------------------------------------
	    |   determine residual norm and test for convergence
	    +---------------------------------------------------*/
            zz_mult(&tt1, &c[i], &hh[i][i]);
            zz_mult(&tt2, &s[i], &hh[i][i1]);
            z_add(&hh[i][i], &tt1, &tt2);
            beta = z_abs1(&rs[i1]);
	    if (fits != NULL)
		fprintf(fits, "%8d   %10.2e\n", its, beta);
	    if (beta <= eps1 || its >= maxits)
		break;
	}

	if (i == im) i--;

	/*---- now compute solution. 1st, solve upper triangular system ----*/
	z_div(&rs[i], &rs[i], &hh[i][i]);

	for (int ii = 1; ii <= i; ii++)
	{
	    int k = i - ii;
	    doublecomplex tt = rs[k];
	    for (int j = k + 1; j <= i; j++) {
                zz_mult(&tt1, &hh[j][k], &rs[j]);
		z_sub(&tt, &tt, &tt1);
            }
            z_div(&rs[k], &tt, &hh[k][k]);
	}

	/*---- linear combination of v[i]'s to get sol. ----*/
	for (int j = 0; j <= i; j++)
	{
	    doublecomplex tt = rs[j];
	    for (int k = 0; k < n; k++) {
                zz_mult(&tt1, &tt, &z[j][k]);
		z_add(&sol[k], &sol[k], &tt1);
            }
	}

	/* calculate the residual and output */
	zmatvec(one, sol, zero, vv[0]);
	for (int j = 0; j < n; j++)
	    z_sub(&vv[0][j], &rhs[j], &vv[0][j]);/* vv[0]= initial residual */

	/*---- print info if fits != null ----*/
	beta = dznrm2_(&n, vv[0], &i_1);

	/*---- restart outer loop if needed ----*/
	/*if (beta >= eps1 / tol)*/
	if ( !(beta < eps1 / tol) )
	{
	    its = maxits + 10;
	    break;
	}
	if (beta <= eps1)
	    break;
    } while(its < maxits);

    int retval = (its >= maxits);
    for (int i = 0; i <= im; i++)
	SUPERLU_FREE(vv[i]);
    SUPERLU_FREE(vv);
    for (int i = 0; i < im; i++)
    {
	SUPERLU_FREE(hh[i]);
	SUPERLU_FREE(z[i]);
    }
    SUPERLU_FREE(hh);
    SUPERLU_FREE(z);
    SUPERLU_FREE(c);
    SUPERLU_FREE(s);
    SUPERLU_FREE(rs);

    *itmax = its;

    return retval;
}